

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pca.hpp
# Opt level: O3

void PCA::run_pca(pca_params *params,vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *v_input,
                 vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *v_output)

{
  pointer ppgVar1;
  void *pvVar2;
  bool bVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ggml_tensor *pgVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  ggml_tensor *pgVar12;
  size_t sVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  char *pcVar17;
  string *str;
  string *str_00;
  ulong uVar18;
  int iVar19;
  ggml_tensor *pgVar20;
  float d;
  pca_model model;
  uint local_18c;
  ggml_tensor *local_188;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> vStack_180;
  vector<float,_std::allocator<float>_> local_168;
  ggml_tensor *local_148;
  uint local_13c;
  undefined1 *local_138;
  undefined8 uStack_130;
  undefined1 local_128;
  undefined5 uStack_127;
  undefined2 uStack_122;
  undefined6 uStack_120;
  undefined1 local_11a;
  undefined8 local_118;
  string local_110;
  long *local_f0;
  undefined8 local_e8;
  long local_e0;
  undefined1 local_d8;
  undefined1 local_d7;
  long *local_d0 [2];
  long local_c0 [2];
  string local_b0;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *local_90;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *local_88;
  ulong local_80;
  ulong local_78;
  ggml_tensor *local_70;
  pca_model local_68;
  
  local_88 = v_output;
  printf("%s: Running PCA...\n","run_pca");
  if ((v_input->super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (v_input->super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    return;
  }
  uVar16 = 0;
  local_90 = v_input;
LAB_00127407:
  local_70 = (local_88->super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar16];
  local_78 = uVar16 + 1;
  ggml_format_name(local_70,"direction.%zu");
  params->i_layer = (int)uVar16;
  ppgVar1 = (v_input->super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  params->n_layers =
       (int)((ulong)((long)(v_input->
                           super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)ppgVar1) >> 3);
  local_80 = uVar16;
  pca_model::pca_model(&local_68,ppgVar1[uVar16]);
  uVar7 = ggml_backend_get_default_buffer_type(local_68.backend);
  local_118 = ggml_gallocr_new(uVar7);
  local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vStack_180.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_180.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188 = (ggml_tensor *)0x0;
  vStack_180.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_13c = params->n_iterations / params->n_batch;
  if ((int)local_13c < 1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/cvector-generator/pca.hpp"
               ,0x11f,"GGML_ASSERT(%s) failed","last_eigenvector");
  }
  if (params->n_batch < 1) {
LAB_00127bf3:
    pcVar17 = "params.n_batch > 0";
    uVar7 = 0x8a;
LAB_00127c1b:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/cvector-generator/pca.hpp"
               ,uVar7,"GGML_ASSERT(%s) failed",pcVar17);
  }
  local_148 = (ggml_tensor *)0x0;
  bVar3 = true;
  local_18c = 0;
  do {
    if ((build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)::buf_size == '\0') &&
       (iVar19 = __cxa_guard_acquire(&build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)
                                      ::buf_size), iVar19 != 0)) {
      lVar14 = ggml_tensor_overhead();
      lVar15 = ggml_graph_overhead();
      build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)::buf_size =
           (undefined1 *)(lVar15 + lVar14 * 0x800);
      __cxa_guard_release(&build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)::
                           buf_size);
    }
    if ((build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)::buf == '\0') &&
       (iVar19 = __cxa_guard_acquire(&build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)
                                      ::buf), iVar19 != 0)) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)::buf,
                 (size_type)
                 build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)::buf_size,
                 (allocator_type *)&local_110);
      __cxa_atexit(std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector,
                   &build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)::buf,
                   &__dso_handle);
      __cxa_guard_release(&build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)::buf
                         );
    }
    local_138 = build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)::buf_size;
    uStack_130 = build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)::buf;
    local_128 = 1;
    uVar7 = ggml_init();
    uVar8 = ggml_new_graph(uVar7);
    pgVar9 = local_68.dev_square;
    if (bVar3) {
      pgVar9 = (ggml_tensor *)ggml_mul_mat(uVar7,local_68.dev_input);
      ggml_set_name(pgVar9,"tmp_square");
    }
    if (0 < params->n_batch) {
      iVar19 = 0;
      pgVar20 = local_68.dev_eigenvector;
      do {
        uVar10 = ggml_mul_mat(uVar7,pgVar9,pgVar20);
        ggml_set_name(uVar10,"b_tensor");
        uVar11 = ggml_sqr(uVar7,uVar10);
        uVar11 = ggml_sum_rows(uVar7,uVar11);
        uVar11 = ggml_sqrt_inplace(uVar7,uVar11);
        pgVar12 = (ggml_tensor *)ggml_div_inplace(uVar7,uVar10,uVar11);
        ggml_format_name(pgVar12,"b_tensor_norm_%d",iVar19);
        uVar10 = ggml_scale(0xbf800000,uVar7,pgVar12);
        uVar10 = ggml_add(uVar7,pgVar20,uVar10);
        uVar10 = ggml_sqr_inplace(uVar7,uVar10);
        uVar10 = ggml_sum_rows(uVar7,uVar10);
        uVar10 = ggml_sqrt_inplace(uVar7,uVar10);
        ggml_format_name(uVar10,"distance_%d",iVar19);
        ggml_build_forward_expand(uVar8,uVar10);
        iVar19 = iVar19 + 1;
        pgVar20 = pgVar12;
      } while (iVar19 < params->n_batch);
    }
    ggml_free(uVar7);
    ggml_gallocr_alloc_graph(local_118,uVar8);
    cVar4 = ggml_backend_is_cpu(local_68.backend);
    if (cVar4 != '\0') {
      ggml_backend_cpu_set_n_threads(local_68.backend,params->n_threads);
    }
    iVar19 = ggml_backend_graph_compute(local_68.backend,uVar8);
    if (iVar19 == 0) {
      local_188 = (ggml_tensor *)0x0;
      if (vStack_180.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          vStack_180.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        vStack_180.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             vStack_180.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      if (local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::resize
                (&vStack_180,(long)params->n_batch);
      std::vector<float,_std::allocator<float>_>::resize(&local_168,(long)params->n_batch);
      iVar19 = ggml_graph_n_nodes(uVar8);
      if (0 < iVar19) {
        iVar19 = 0;
        do {
          pgVar9 = (ggml_tensor *)ggml_graph_node(uVar8,iVar19);
          local_138 = &local_128;
          uStack_120 = 0x5f6d726f6e5f;
          local_128 = 0x62;
          uStack_127 = 0x736e65745f;
          uStack_122 = 0x726f;
          uStack_130 = 0xe;
          local_11a = 0;
          pcVar17 = pgVar9->name;
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          sVar13 = strlen(pcVar17);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_110,pcVar17,pgVar9->name + sVar13);
          uVar5 = compute_piter::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)&local_138,&local_110,str);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          if (local_138 != &local_128) {
            operator_delete(local_138,CONCAT26(uStack_122,CONCAT51(uStack_127,local_128)) + 1);
          }
          if (-1 < (int)uVar5) {
            vStack_180.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
            super__Vector_impl_data._M_start[uVar5] = pgVar9;
          }
          local_f0 = &local_e0;
          local_e0 = 0x65636e6174736964;
          local_d8 = 0x5f;
          local_e8 = 9;
          local_d7 = 0;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          sVar13 = strlen(pcVar17);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,pcVar17,pcVar17 + sVar13);
          uVar5 = compute_piter::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)&local_f0,&local_b0,str_00);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if (local_f0 != &local_e0) {
            operator_delete(local_f0,local_e0 + 1);
          }
          if (-1 < (int)uVar5) {
            ggml_backend_tensor_get(pgVar9,local_d0,0,4);
            local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[uVar5] = local_d0[0]._0_4_;
          }
          local_d0[0] = local_c0;
          sVar13 = strlen(pcVar17);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d0,pcVar17,pcVar17 + sVar13);
          iVar6 = std::__cxx11::string::compare((char *)local_d0);
          if (local_d0[0] != local_c0) {
            operator_delete(local_d0[0],local_c0[0] + 1);
          }
          if (iVar6 == 0) {
            local_188 = pgVar9;
          }
          iVar6 = ggml_graph_n_nodes(uVar8);
          iVar19 = iVar19 + 1;
        } while (iVar19 < iVar6);
      }
    }
    if ((long)local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      uVar16 = 1;
      do {
        uVar18 = uVar16;
        if (local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[uVar18 - 1] <= params->tolerance &&
            params->tolerance !=
            local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[uVar18 - 1]) break;
        uVar16 = uVar18 + 1;
      } while (uVar18 < (ulong)((long)local_168.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                                (long)local_168.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start >> 2));
      local_148 = vStack_180.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar18 - 1];
    }
    if (bVar3) {
      if (local_188 == (ggml_tensor *)0x0) {
        uVar7 = 0x110;
        pcVar17 = "result.calculated_square != NULL";
        goto LAB_00127c1b;
      }
      ggml_backend_tensor_copy(local_188,local_68.dev_square);
    }
    if (local_148 == (ggml_tensor *)0x0) {
      uVar7 = 0x116;
      pcVar17 = "last_eigenvector != NULL";
      goto LAB_00127c1b;
    }
    ggml_backend_tensor_copy(local_148,local_68.dev_eigenvector);
    uVar5 = local_13c;
    local_18c = local_18c + 1;
    printf("%s: layer %d/%d, iteration: %d / total: %d (batch = %d) ...\n","power_iteration",
           (ulong)(params->i_layer + 1),(ulong)(uint)params->n_layers,(ulong)local_18c,
           (ulong)local_13c,params->n_batch);
    pgVar9 = local_148;
    if (local_18c == uVar5) break;
    bVar3 = false;
    if (params->n_batch < 1) goto LAB_00127bf3;
  } while( true );
  pvVar2 = local_70->data;
  uVar7 = ggml_nbytes(local_148);
  ggml_backend_tensor_get(pgVar9,pvVar2,0,uVar7);
  ggml_gallocr_free(local_118);
  if (local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (vStack_180.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_180.super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)vStack_180.
                          super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_180.
                          super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pca_model::~pca_model(&local_68);
  v_input = local_90;
  printf("%s: Done layer %d / %d\n","run_pca",(ulong)((int)local_80 + 1),
         (ulong)((long)(local_90->super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>)
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_90->super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>).
                      _M_impl.super__Vector_impl_data._M_start) >> 3);
  uVar16 = local_78;
  if ((ulong)((long)(v_input->super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(v_input->super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) <= local_78) {
    return;
  }
  goto LAB_00127407;
}

Assistant:

static void run_pca(
        struct pca_params & params,
        const std::vector<struct ggml_tensor *> & v_input, // shape of v_input[0]: [n_samples, n_embd]
        const std::vector<struct ggml_tensor *> & v_output) {
    printf("%s: Running PCA...\n", __func__);
    for (size_t il = 0; il < v_input.size(); ++il) {

        // prepare output vector
        struct ggml_tensor * ctrl_out = v_output[il];
        ggml_format_name(ctrl_out, "direction.%zu", il+1);

        // run power_iteration
        params.i_layer = il;
        params.n_layers = v_input.size();
        power_iteration(params, v_input[il], ctrl_out);
        printf("%s: Done layer %d / %d\n", __func__, (int) il+1, (int) v_input.size());
    }
}